

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O3

void _DOCTEST_ANON_TMP_38<std::deque<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>>
               (void)

{
  tuple<char,_int> tVar1;
  bool bVar2;
  ulong uVar3;
  Result *pRVar4;
  _Map_pointer pptVar5;
  Result *pRVar6;
  Result *in_R9;
  OutputStream ostream;
  deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> in;
  deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> out;
  stringstream stream;
  undefined1 auStack_2d8 [12];
  ExpressionDecomposer local_2cc;
  unsigned_long local_2c8;
  OutputStream local_2c0;
  _Deque_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> local_2b8;
  undefined1 local_268 [8];
  _Elt_pointer local_260;
  _Elt_pointer local_258;
  _Map_pointer local_250;
  undefined1 local_248 [32];
  _Deque_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> local_228;
  Result local_1d0;
  undefined1 local_1b0 [16];
  undefined5 local_1a0;
  undefined3 uStack_19b;
  undefined8 local_198;
  undefined4 local_190;
  undefined1 local_18c;
  undefined4 local_188;
  undefined1 local_184;
  undefined4 local_180;
  undefined1 local_17c;
  undefined4 local_178;
  undefined1 local_174;
  undefined4 local_170;
  undefined1 local_16c;
  undefined4 local_168;
  undefined1 local_164;
  ios_base local_130 [264];
  
  local_1b0._0_5_ = 0x3100000002;
  local_1b0._8_5_ = 0x3300000004;
  local_1a0 = 0x3500000006;
  local_198._0_5_ = 0x3700000008;
  local_190 = 10;
  local_18c = 0x39;
  local_188 = 0xc;
  local_184 = 0x41;
  local_180 = 0xe;
  local_17c = 0x43;
  local_178 = 0xf;
  local_174 = 0x45;
  local_170 = 0x11;
  local_16c = 0x47;
  local_168 = 0x13;
  local_164 = 0x49;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_2b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::deque<std::tuple<char,int>,std::allocator<std::tuple<char,int>>>::
  _M_range_initialize<std::tuple<char,int>const*>();
  local_228._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_228._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::
  _M_initialize_map(&local_228,0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  tVar1.super__Tuple_impl<0UL,_char,_int> =
       *(_Tuple_impl<0UL,_char,_int> *)(local_1b0._0_8_ + -0x18);
  *(undefined4 *)((long)&local_198 + (long)tVar1.super__Tuple_impl<0UL,_char,_int> + 4) = 4;
  std::ios::clear((int)auStack_2d8 +
                  (int)tVar1.super__Tuple_impl<0UL,_char,_int>.super__Tuple_impl<1UL,_int>.
                       super__Head_base<1UL,_int,_false>._M_head_impl.
                       super__Head_base<1UL,_int,_false> + 0x128);
  local_2c0.stream = (stringstream *)local_1b0;
  mserialize::detail::
  BuiltinSerializer<std::deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
  ::serialize<OutputStream>
            ((deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)&local_2b8,
             &local_2c0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_2cc,DT_CHECK);
  local_268 = (undefined1  [8])std::ostream::tellp();
  local_260 = (_Elt_pointer)CONCAT44(local_260._4_4_,local_2cc.m_at);
  if (local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
      local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_2c8 = 4;
  }
  else {
    local_2c8 = 4;
    pRVar4 = (Result *)local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar5 = local_2b8._M_impl.super__Deque_impl_data._M_start._M_node;
    pRVar6 = (Result *)local_2b8._M_impl.super__Deque_impl_data._M_start._M_last;
    do {
      pRVar4 = (Result *)&pRVar4->m_decomp;
      if (pRVar4 == pRVar6) {
        pRVar4 = (Result *)pptVar5[1];
        pptVar5 = pptVar5 + 1;
        pRVar6 = pRVar4 + 0x10;
      }
      local_2c8 = local_2c8 + 5;
    } while (pRVar4 != (Result *)local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            ((Result *)local_248,(Expression_lhs<unsigned_long> *)local_268,&local_2c8);
  doctest::detail::decomp_assert((detail *)0xa,0x1b61dc,(char *)0x36,0x1b643d,local_248,in_R9);
  doctest::String::~String((String *)(local_248 + 8));
  local_268 = (undefined1  [8])local_1b0;
  mserialize::detail::
  BuiltinDeserializer<std::deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
  ::deserialize<InputStream>
            ((deque<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *)&local_228,
             (InputStream *)local_268);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&local_2c8,DT_CHECK);
  pRVar6 = (Result *)local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (((long)local_2b8._M_impl.super__Deque_impl_data._M_start._M_last -
       (long)local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
      ((long)local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
      ((((ulong)((long)local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node -
                (long)local_2b8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
      0x40 == ((long)local_228._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)local_228._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
              ((long)local_228._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)local_228._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)local_228._M_impl.super__Deque_impl_data._M_finish._M_node -
                        (long)local_228._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(local_228._M_impl.super__Deque_impl_data._M_finish._M_node ==
                       (_Map_pointer)0x0)) * 0x40) {
    local_248._0_8_ = local_2b8._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_248._8_8_ = local_2b8._M_impl.super__Deque_impl_data._M_start._M_first;
    local_248._16_8_ = local_2b8._M_impl.super__Deque_impl_data._M_start._M_last;
    local_248._24_8_ = local_2b8._M_impl.super__Deque_impl_data._M_start._M_node;
    local_268 = (undefined1  [8])local_2b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_260 = local_2b8._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_258 = local_2b8._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_250 = local_2b8._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_1b0._0_8_ = local_228._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1b0._8_8_ = local_228._M_impl.super__Deque_impl_data._M_start._M_first;
    _local_1a0 = local_228._M_impl.super__Deque_impl_data._M_start._M_last;
    local_198 = local_228._M_impl.super__Deque_impl_data._M_start._M_node;
    bVar2 = std::
            __equal_dit<std::tuple<char,int>,std::tuple<char,int>const&,std::tuple<char,int>const*,std::_Deque_iterator<std::tuple<char,int>,std::tuple<char,int>&,std::tuple<char,int>*>>
                      ((_Deque_iterator<std::tuple<char,_int>,_const_std::tuple<char,_int>_&,_const_std::tuple<char,_int>_*>
                        *)local_248,
                       (_Deque_iterator<std::tuple<char,_int>,_const_std::tuple<char,_int>_&,_const_std::tuple<char,_int>_*>
                        *)local_268,
                       (_Deque_iterator<std::tuple<char,_int>,_std::tuple<char,_int>_&,_std::tuple<char,_int>_*>
                        *)local_1b0);
    uVar3 = (ulong)bVar2;
  }
  else {
    uVar3 = 0;
  }
  local_2c0.stream = (stringstream *)(local_2c8 << 0x20 | uVar3);
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_1d0,(Expression_lhs *)&local_2c0);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b61dc,(char *)0x111,0x1b6737,&local_1d0.m_passed,pRVar6);
  doctest::String::~String(&local_1d0.m_decomp);
  std::_Deque_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::~_Deque_base
            (&local_228);
  std::_Deque_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>::~_Deque_base
            (&local_2b8);
  return;
}

Assistant:

auto container_equal()
{
  return [](auto& a, auto& b)
  {
    using std::begin;
    using std::end;
    return std::equal(begin(a), end(a), begin(b), end(b));
  };
}